

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-matrix.c
# Opt level: O2

void plutovg_matrix_map_rect(plutovg_matrix_t *matrix,plutovg_rect_t *src,plutovg_rect_t *dst)

{
  undefined4 uVar1;
  undefined4 uVar3;
  plutovg_point_t pVar2;
  undefined1 auVar4 [16];
  int i;
  long lVar5;
  float fVar6;
  float fVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  float fVar10;
  float fVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  plutovg_point_t local_38;
  plutovg_point_t local_30 [2];
  float local_20;
  float local_1c;
  
  local_38.x = src->x;
  local_38.y = src->y;
  uVar1 = src->w;
  uVar3 = src->h;
  local_30[0].x = (float)uVar1 + local_38.x;
  local_1c = (float)uVar3 + local_38.y;
  local_30[1] = (plutovg_point_t)CONCAT44(local_1c,local_30[0].x);
  local_30[0].y = local_38.y;
  local_20 = local_38.x;
  plutovg_matrix_map_points(matrix,&local_38,&local_38,4);
  fVar6 = local_38.x;
  fVar7 = local_38.y;
  uVar8 = 0;
  uVar9 = 0;
  fVar10 = fVar6;
  fVar11 = fVar7;
  uVar12 = uVar8;
  uVar13 = uVar9;
  for (lVar5 = 1; lVar5 != 4; lVar5 = lVar5 + 1) {
    pVar2 = (&local_38)[lVar5];
    auVar14._8_8_ = 0;
    auVar14._0_4_ = pVar2.x;
    auVar14._4_4_ = pVar2.y;
    auVar16._8_8_ = 0;
    auVar16._0_4_ = pVar2.x;
    auVar16._4_4_ = pVar2.y;
    auVar15._4_4_ = fVar7;
    auVar15._0_4_ = fVar6;
    auVar15._8_4_ = uVar8;
    auVar15._12_4_ = uVar9;
    auVar16 = minps(auVar16,auVar15);
    auVar4._4_4_ = fVar11;
    auVar4._0_4_ = fVar10;
    auVar4._8_4_ = uVar12;
    auVar4._12_4_ = uVar13;
    auVar15 = maxps(auVar14,auVar4);
    fVar6 = auVar16._0_4_;
    fVar7 = auVar16._4_4_;
    uVar8 = auVar16._8_4_;
    uVar9 = auVar16._12_4_;
    fVar10 = auVar15._0_4_;
    fVar11 = auVar15._4_4_;
    uVar12 = auVar15._8_4_;
    uVar13 = auVar15._12_4_;
  }
  dst->x = fVar6;
  dst->y = fVar7;
  dst->w = fVar10 - fVar6;
  dst->h = fVar11 - fVar7;
  return;
}

Assistant:

void plutovg_matrix_map_rect(const plutovg_matrix_t* matrix, const plutovg_rect_t* src, plutovg_rect_t* dst)
{
    plutovg_point_t p[4];
    p[0].x = src->x;
    p[0].y = src->y;
    p[1].x = src->x + src->w;
    p[1].y = src->y;
    p[2].x = src->x + src->w;
    p[2].y = src->y + src->h;
    p[3].x = src->x;
    p[3].y = src->y + src->h;
    plutovg_matrix_map_points(matrix, p, p, 4);

    float l = p[0].x;
    float t = p[0].y;
    float r = p[0].x;
    float b = p[0].y;

    for(int i = 1; i < 4; i++) {
        if(p[i].x < l) l = p[i].x;
        if(p[i].x > r) r = p[i].x;
        if(p[i].y < t) t = p[i].y;
        if(p[i].y > b) b = p[i].y;
    }

    dst->x = l;
    dst->y = t;
    dst->w = r - l;
    dst->h = b - t;
}